

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O0

void ptls_asn1_print_type
               (int type_class,uint32_t type_number,int level,ptls_minicrypto_log_ctx_t *log_ctx)

{
  ptls_minicrypto_log_ctx_t *log_ctx_local;
  int level_local;
  uint32_t type_number_local;
  int type_class_local;
  
  ptls_asn1_print_indent(level,log_ctx);
  if ((type_class == 0) && (type_number < nb_asn1_universal_types)) {
    (*log_ctx->fn)(log_ctx->ctx,"%s",asn1_universal_types[type_number]);
  }
  else if (type_class == 2) {
    (*log_ctx->fn)(log_ctx->ctx,"[%d]",(ulong)type_number);
  }
  else {
    (*log_ctx->fn)(log_ctx->ctx,"%s[%d]",asn1_type_classes[type_class],(ulong)type_number);
  }
  return;
}

Assistant:

void ptls_asn1_print_type(int type_class, uint32_t type_number, int level, ptls_minicrypto_log_ctx_t *log_ctx)
{
    /* Print the type */
    ptls_asn1_print_indent(level, log_ctx);
    if (type_class == 0 && type_number < nb_asn1_universal_types) {
        log_ctx->fn(log_ctx->ctx, "%s", asn1_universal_types[type_number]);
    } else if (type_class == 2) {
        log_ctx->fn(log_ctx->ctx, "[%d]", type_number);
    } else {
        log_ctx->fn(log_ctx->ctx, "%s[%d]", asn1_type_classes[type_class], type_number);
    }
}